

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O0

DdNode * Cudd_addOneZeroMaximum(DdManager *dd,DdNode **f,DdNode **g)

{
  DdNode **g_local;
  DdNode **f_local;
  DdManager *dd_local;
  
  if (*f == *g) {
    dd_local = (DdManager *)dd->zero;
  }
  else if (*g == dd->plusinfinity) {
    dd_local = (DdManager *)dd->zero;
  }
  else if (((*f)->index == 0x7fffffff) && ((*g)->index == 0x7fffffff)) {
    if (((*f)->type).value < ((*g)->type).value || ((*f)->type).value == ((*g)->type).value) {
      dd_local = (DdManager *)dd->zero;
    }
    else {
      dd_local = (DdManager *)dd->one;
    }
  }
  else {
    dd_local = (DdManager *)0x0;
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addOneZeroMaximum(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{

    if (*f == *g) return(DD_ZERO(dd));
    if (*g == DD_PLUS_INFINITY(dd))
        return DD_ZERO(dd);
    if (cuddIsConstant(*f) && cuddIsConstant(*g)) {
        if (cuddV(*f) > cuddV(*g)) {
            return(DD_ONE(dd));
        } else {
            return(DD_ZERO(dd));
        }
    }

    return(NULL);

}